

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmMakefileTargetGenerator::WriteObjectsVariable
          (cmMakefileTargetGenerator *this,string *variableName,string *variableNameExternal,
          bool useWatcomQuote)

{
  cmLocalUnixMakefileGenerator3 *pcVar1;
  cmGeneratedFileStream *pcVar2;
  cmMakefile *this_00;
  string *psVar3;
  ostream *poVar4;
  char *pcVar5;
  size_t sVar6;
  string *psVar7;
  undefined1 useWatcomQuote_00;
  pointer pbVar8;
  char *__s;
  string currentBinDir;
  string object;
  string local_98;
  string local_78;
  string local_58;
  string *local_38;
  
  psVar7 = &local_98;
  pcVar1 = this->LocalGenerator;
  psVar3 = cmGeneratorTarget::GetName_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).GeneratorTarget);
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"_OBJECTS","");
  cmLocalUnixMakefileGenerator3::CreateMakeVariable(&local_58,pcVar1,psVar3,&local_98);
  std::__cxx11::string::operator=((string *)variableName,(string *)&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  pcVar2 = this->BuildFileStream;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)pcVar2,"# Object files for target ",0x1a);
  psVar3 = cmGeneratorTarget::GetName_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).GeneratorTarget);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)pcVar2,(psVar3->_M_dataplus)._M_p,psVar3->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(variableName->_M_dataplus)._M_p,variableName->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," =",2);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  this_00 = (this->super_cmCommonTargetGenerator).Makefile;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"CMAKE_MAKE_LINE_CONTINUE","")
  ;
  pcVar5 = cmMakefile::GetDefinition(this_00,&local_98);
  local_38 = variableNameExternal;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  __s = "\\";
  if (pcVar5 != (char *)0x0) {
    __s = pcVar5;
  }
  pbVar8 = (this->Objects).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pbVar8 != (this->Objects).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      pcVar2 = this->BuildFileStream;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pcVar2," ",1);
      sVar6 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pcVar2,__s,sVar6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pcVar2,"\n",1);
      pcVar2 = this->BuildFileStream;
      cmLocalUnixMakefileGenerator3::ConvertToQuotedOutputPath_abi_cxx11_
                (&local_98,(cmLocalUnixMakefileGenerator3 *)(pbVar8->_M_dataplus)._M_p,
                 (char *)(ulong)useWatcomQuote,SUB81(psVar7,0));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pcVar2,local_98._M_dataplus._M_p,local_98._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      pbVar8 = pbVar8 + 1;
    } while (pbVar8 != (this->Objects).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this->BuildFileStream,"\n",1);
  psVar3 = local_38;
  pcVar1 = this->LocalGenerator;
  psVar7 = cmGeneratorTarget::GetName_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).GeneratorTarget);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"_EXTERNAL_OBJECTS","");
  cmLocalUnixMakefileGenerator3::CreateMakeVariable(&local_98,pcVar1,psVar7,&local_78);
  std::__cxx11::string::operator=((string *)psVar3,(string *)&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  pcVar2 = this->BuildFileStream;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)pcVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)pcVar2,"# External object files for target ",0x23);
  psVar7 = cmGeneratorTarget::GetName_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).GeneratorTarget);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)pcVar2,(psVar7->_M_dataplus)._M_p,psVar7->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(psVar3->_M_dataplus)._M_p,psVar3->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," =",2);
  pcVar5 = cmLocalGenerator::GetCurrentBinaryDirectory((cmLocalGenerator *)this->LocalGenerator);
  std::__cxx11::string::string((string *)&local_98,pcVar5,(allocator *)&local_78);
  pbVar8 = (this->ExternalObjects).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pbVar8 != (this->ExternalObjects).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      psVar3 = pbVar8;
      cmLocalUnixMakefileGenerator3::MaybeConvertToRelativePath
                (&local_78,this->LocalGenerator,&local_98,pbVar8);
      useWatcomQuote_00 = SUB81(psVar3,0);
      std::__cxx11::string::operator=((string *)&local_58,(string *)&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      pcVar2 = this->BuildFileStream;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pcVar2," ",1);
      sVar6 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pcVar2,__s,sVar6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pcVar2,"\n",1);
      pcVar2 = this->BuildFileStream;
      cmLocalUnixMakefileGenerator3::ConvertToQuotedOutputPath_abi_cxx11_
                (&local_78,(cmLocalUnixMakefileGenerator3 *)(pbVar8->_M_dataplus)._M_p,
                 (char *)(ulong)useWatcomQuote,(bool)useWatcomQuote_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pcVar2,local_78._M_dataplus._M_p,local_78._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      pbVar8 = pbVar8 + 1;
    } while (pbVar8 != (this->ExternalObjects).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  pcVar2 = this->BuildFileStream;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)pcVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)pcVar2,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void cmMakefileTargetGenerator::WriteObjectsVariable(
  std::string& variableName, std::string& variableNameExternal,
  bool useWatcomQuote)
{
  // Write a make variable assignment that lists all objects for the
  // target.
  variableName = this->LocalGenerator->CreateMakeVariable(
    this->GeneratorTarget->GetName(), "_OBJECTS");
  *this->BuildFileStream << "# Object files for target "
                         << this->GeneratorTarget->GetName() << "\n"
                         << variableName << " =";
  std::string object;
  const char* lineContinue =
    this->Makefile->GetDefinition("CMAKE_MAKE_LINE_CONTINUE");
  if (!lineContinue) {
    lineContinue = "\\";
  }
  for (std::vector<std::string>::const_iterator i = this->Objects.begin();
       i != this->Objects.end(); ++i) {
    *this->BuildFileStream << " " << lineContinue << "\n";
    *this->BuildFileStream << this->LocalGenerator->ConvertToQuotedOutputPath(
      i->c_str(), useWatcomQuote);
  }
  *this->BuildFileStream << "\n";

  // Write a make variable assignment that lists all external objects
  // for the target.
  variableNameExternal = this->LocalGenerator->CreateMakeVariable(
    this->GeneratorTarget->GetName(), "_EXTERNAL_OBJECTS");
  /* clang-format off */
  *this->BuildFileStream
    << "\n"
    << "# External object files for target "
    << this->GeneratorTarget->GetName() << "\n"
    << variableNameExternal << " =";
  /* clang-format on */
  std::string currentBinDir =
    this->LocalGenerator->GetCurrentBinaryDirectory();
  for (std::vector<std::string>::const_iterator i =
         this->ExternalObjects.begin();
       i != this->ExternalObjects.end(); ++i) {
    object =
      this->LocalGenerator->MaybeConvertToRelativePath(currentBinDir, *i);
    *this->BuildFileStream << " " << lineContinue << "\n";
    *this->BuildFileStream << this->LocalGenerator->ConvertToQuotedOutputPath(
      i->c_str(), useWatcomQuote);
  }
  *this->BuildFileStream << "\n"
                         << "\n";
}